

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

Pdr_Set_t * Pdr_SetCreateSubset(Pdr_Set_t *pSet,int *pLits,int nLits)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Pdr_Set_t *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  if (-1 < nLits) {
    iVar3 = pSet->nLits;
    lVar8 = (long)iVar3;
    if (nLits <= iVar3) {
      iVar1 = pSet->nTotal;
      iVar3 = (nLits - iVar3) + iVar1;
      pPVar4 = (Pdr_Set_t *)malloc((long)iVar3 * 4 + 0x18);
      pPVar4->nLits = nLits;
      pPVar4->nTotal = iVar3;
      pPVar4->nRefs = 1;
      pPVar4->Sign = 0;
      uVar6 = (ulong)(uint)nLits;
      uVar5 = 0;
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        uVar2 = pLits[uVar7];
        if ((int)uVar2 < 0) {
          __assert_fail("pLits[i] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                        ,0x90,"Pdr_Set_t *Pdr_SetCreateSubset(Pdr_Set_t *, int *, int)");
        }
        *(uint *)(&pPVar4->field_0x14 + uVar7 * 4) = uVar2;
        uVar5 = uVar5 | 1L << (ulong)uVar2 % 0x3f;
        pPVar4->Sign = uVar5;
      }
      Vec_IntSelectSort((int *)&pPVar4->field_0x14,nLits);
      for (; lVar8 < iVar1; lVar8 = lVar8 + 1) {
        *(undefined4 *)(&pPVar4->field_0x14 + uVar6 * 4) =
             *(undefined4 *)(&pSet->field_0x14 + lVar8 * 4);
        uVar6 = uVar6 + 1;
      }
      if (pPVar4->nTotal == (int)uVar6) {
        return pPVar4;
      }
      __assert_fail("k == p->nTotal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                    ,0x97,"Pdr_Set_t *Pdr_SetCreateSubset(Pdr_Set_t *, int *, int)");
    }
  }
  __assert_fail("nLits >= 0 && nLits <= pSet->nLits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                ,0x88,"Pdr_Set_t *Pdr_SetCreateSubset(Pdr_Set_t *, int *, int)");
}

Assistant:

Pdr_Set_t * Pdr_SetCreateSubset( Pdr_Set_t * pSet, int * pLits, int nLits )
{
    Pdr_Set_t * p;
    int i, k = 0;
    assert( nLits >= 0 && nLits <= pSet->nLits );
    p = (Pdr_Set_t *)ABC_ALLOC( char, sizeof(Pdr_Set_t) + (nLits + pSet->nTotal - pSet->nLits) * sizeof(int) );
    p->nLits  = nLits;
    p->nTotal = nLits + pSet->nTotal - pSet->nLits;
    p->nRefs  = 1;
    p->Sign   = 0;
    for ( i = 0; i < nLits; i++ )
    {
        assert( pLits[i] >= 0 );
        p->Lits[k++] = pLits[i];
        p->Sign   |= ((word)1 << (pLits[i] % 63));
    }
    Vec_IntSelectSort( p->Lits, p->nLits );
    for ( i = pSet->nLits; i < pSet->nTotal; i++ )
        p->Lits[k++] = pSet->Lits[i];
    assert( k == p->nTotal );
    return p;
}